

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall
QHttpThreadDelegate::sslErrorsSlot(QHttpThreadDelegate *this,QList<QSslError> *errors)

{
  long lVar1;
  bool bVar2;
  QHttpThreadDelegate *in_RSI;
  QHttpThreadDelegate *in_RDI;
  long in_FS_OFFSET;
  QList<QSslError> specificErrors;
  bool ignoreAll;
  QHttpThreadDelegate *this_00;
  QList<QSslError> *_t3;
  QHttpNetworkReply *in_stack_ffffffffffffffd8;
  bool *_t2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->httpReply != (QHttpNetworkReply *)0x0) {
    this_00 = in_RDI;
    QHttpNetworkReply::sslConfiguration(in_stack_ffffffffffffffd8);
    sslConfigurationChanged(in_RSI,(QSslConfiguration *)in_RDI);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x310715);
    _t3 = (QList<QSslError> *)0xaaaaaaaaaaaaaaaa;
    _t2 = (bool *)0xaaaaaaaaaaaaaaaa;
    QList<QSslError>::QList((QList<QSslError> *)0x310748);
    sslErrors(this_00,(QList<QSslError> *)in_RSI,_t2,_t3);
    bVar2 = QList<QSslError>::isEmpty((QList<QSslError> *)0x310781);
    if (!bVar2) {
      QHttpNetworkReply::ignoreSslErrors((QHttpNetworkReply *)in_RSI,(QList<QSslError> *)in_RDI);
    }
    QList<QSslError>::~QList((QList<QSslError> *)0x3107a4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::sslErrorsSlot(const QList<QSslError> &errors)
{
    if (!httpReply)
        return;

    emit sslConfigurationChanged(httpReply->sslConfiguration());

    bool ignoreAll = false;
    QList<QSslError> specificErrors;
    emit sslErrors(errors, &ignoreAll, &specificErrors);
    if (ignoreAll)
        httpReply->ignoreSslErrors();
    if (!specificErrors.isEmpty())
        httpReply->ignoreSslErrors(specificErrors);
}